

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpdf-c.cc
# Opt level: O2

qpdf_oh qpdf_oh_wrap_in_array(qpdf_data qpdf,qpdf_oh oh)

{
  uint uVar1;
  _Any_data local_48;
  code *local_38;
  code *local_30;
  _Any_data local_28;
  code *local_18;
  code *local_10;
  
  local_28._8_8_ = 0;
  local_10 = std::
             _Function_handler<unsigned_int_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/libqpdf/qpdf-c.cc:1120:9)>
             ::_M_invoke;
  local_18 = std::
             _Function_handler<unsigned_int_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/libqpdf/qpdf-c.cc:1120:9)>
             ::_M_manager;
  local_48._8_8_ = 0;
  local_30 = std::
             _Function_handler<unsigned_int_(QPDFObjectHandle_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/libqpdf/qpdf-c.cc:1121:9)>
             ::_M_invoke;
  local_38 = std::
             _Function_handler<unsigned_int_(QPDFObjectHandle_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/libqpdf/qpdf-c.cc:1121:9)>
             ::_M_manager;
  local_48._M_unused._M_object = qpdf;
  local_28._M_unused._M_object = qpdf;
  uVar1 = do_with_oh<unsigned_int>
                    (qpdf,oh,(function<unsigned_int_()> *)&local_28,
                     (function<unsigned_int_(QPDFObjectHandle_&)> *)&local_48);
  std::_Function_base::~_Function_base((_Function_base *)&local_48);
  std::_Function_base::~_Function_base((_Function_base *)&local_28);
  return uVar1;
}

Assistant:

qpdf_oh
qpdf_oh_wrap_in_array(qpdf_data qpdf, qpdf_oh oh)
{
    return do_with_oh<qpdf_oh>(
        qpdf,
        oh,
        [qpdf]() { return qpdf_oh_new_array(qpdf); },
        [qpdf](QPDFObjectHandle& qoh) {
            if (qoh.isArray()) {
                QTC::TC("qpdf", "qpdf-c array to wrap_in_array");
                return new_object(qpdf, qoh);
            } else {
                QTC::TC("qpdf", "qpdf-c non-array to wrap_in_array");
                return new_object(
                    qpdf, QPDFObjectHandle::newArray(std::vector<QPDFObjectHandle>{qoh}));
            }
        });
}